

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessBuffersTests.cpp
# Opt level: O1

IterateResult __thiscall
gl4cts::DirectStateAccess::Buffers::FunctionalTest::iterate(FunctionalTest *this)

{
  PFNGLCLEARNAMEDBUFFERDATA p_Var1;
  PFNGLCLEARNAMEDBUFFERSUBDATA p_Var2;
  PFNGLCOPYNAMEDBUFFERSUBDATA p_Var3;
  PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE p_Var4;
  PFNGLGETNAMEDBUFFERPARAMETERI64V p_Var5;
  PFNGLGETNAMEDBUFFERPARAMETERIV p_Var6;
  PFNGLGETNAMEDBUFFERPOINTERV p_Var7;
  PFNGLGETNAMEDBUFFERSUBDATA p_Var8;
  PFNGLMAPNAMEDBUFFER p_Var9;
  PFNGLMAPNAMEDBUFFERRANGE p_Var10;
  PFNGLNAMEDBUFFERDATA p_Var11;
  PFNGLNAMEDBUFFERSTORAGE p_Var12;
  PFNGLNAMEDBUFFERSUBDATA p_Var13;
  PFNGLUNMAPNAMEDBUFFER p_Var14;
  bool bVar15;
  bool bVar16;
  int iVar17;
  ContextType ctxType;
  undefined4 extraout_var;
  undefined4 *puVar19;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  long lVar18;
  
  iVar17 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar17);
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar15 = glu::contextSupports(ctxType,(ApiType)0x154);
  bVar16 = glu::ContextInfo::isExtensionSupported
                     (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_direct_state_access"
                     );
  if ((bVar15) || (bVar16)) {
    p_Var1 = *(PFNGLCLEARNAMEDBUFFERDATA *)(lVar18 + 0x1d8);
    this->m_pClearNamedBufferData = p_Var1;
    p_Var2 = *(PFNGLCLEARNAMEDBUFFERSUBDATA *)(lVar18 + 0x1e0);
    this->m_pClearNamedBufferSubData = p_Var2;
    p_Var3 = *(PFNGLCOPYNAMEDBUFFERSUBDATA *)(lVar18 + 0x340);
    this->m_pCopyNamedBufferSubData = p_Var3;
    p_Var4 = *(PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE *)(lVar18 + 0x660);
    this->m_pFlushMappedNamedBufferRange = p_Var4;
    p_Var5 = *(PFNGLGETNAMEDBUFFERPARAMETERI64V *)(lVar18 + 0x8f0);
    this->m_pGetNamedBufferParameteri64v = p_Var5;
    p_Var6 = *(PFNGLGETNAMEDBUFFERPARAMETERIV *)(lVar18 + 0x8f8);
    this->m_pGetNamedBufferParameteriv = p_Var6;
    p_Var7 = *(PFNGLGETNAMEDBUFFERPOINTERV *)(lVar18 + 0x900);
    this->m_pGetNamedBufferPointerv = p_Var7;
    p_Var8 = *(PFNGLGETNAMEDBUFFERSUBDATA *)(lVar18 + 0x908);
    this->m_pGetNamedBufferSubData = p_Var8;
    p_Var9 = *(PFNGLMAPNAMEDBUFFER *)(lVar18 + 0xd08);
    this->m_pMapNamedBuffer = p_Var9;
    p_Var10 = *(PFNGLMAPNAMEDBUFFERRANGE *)(lVar18 + 0xd10);
    this->m_pMapNamedBufferRange = p_Var10;
    p_Var11 = *(PFNGLNAMEDBUFFERDATA *)(lVar18 + 0xec0);
    this->m_pNamedBufferData = p_Var11;
    p_Var12 = *(PFNGLNAMEDBUFFERSTORAGE *)(lVar18 + 0xed8);
    this->m_pNamedBufferStorage = p_Var12;
    p_Var13 = *(PFNGLNAMEDBUFFERSUBDATA *)(lVar18 + 0xee0);
    this->m_pNamedBufferSubData = p_Var13;
    p_Var14 = *(PFNGLUNMAPNAMEDBUFFER *)(lVar18 + 0x1678);
    this->m_pUnmapNamedBuffer = p_Var14;
    if (((((((p_Var1 == (PFNGLCLEARNAMEDBUFFERDATA)0x0) ||
            (p_Var2 == (PFNGLCLEARNAMEDBUFFERSUBDATA)0x0)) ||
           (p_Var3 == (PFNGLCOPYNAMEDBUFFERSUBDATA)0x0)) ||
          ((p_Var4 == (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)0x0 ||
           (p_Var5 == (PFNGLGETNAMEDBUFFERPARAMETERI64V)0x0)))) ||
         ((p_Var6 == (PFNGLGETNAMEDBUFFERPARAMETERIV)0x0 ||
          ((p_Var7 == (PFNGLGETNAMEDBUFFERPOINTERV)0x0 ||
           (p_Var8 == (PFNGLGETNAMEDBUFFERSUBDATA)0x0)))))) || (p_Var9 == (PFNGLMAPNAMEDBUFFER)0x0))
       || ((((p_Var10 == (PFNGLMAPNAMEDBUFFERRANGE)0x0 || (p_Var11 == (PFNGLNAMEDBUFFERDATA)0x0)) ||
            (p_Var12 == (PFNGLNAMEDBUFFERSTORAGE)0x0)) ||
           ((p_Var13 == (PFNGLNAMEDBUFFERSUBDATA)0x0 || (p_Var14 == (PFNGLUNMAPNAMEDBUFFER)0x0))))))
    {
      puVar19 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar19 = 0;
      __cxa_throw(puVar19,&int::typeinfo,0);
    }
    BuildProgram(this);
    PrepareVertexArrayObject(this);
    bVar15 = PrepareInputBuffer(this);
    if (bVar15) {
      bVar15 = PrepareOutputBuffer(this);
    }
    else {
      bVar15 = false;
    }
    if (((bVar15 == false) || (Draw(this), bVar15 == false)) ||
       ((bVar15 = CheckArrayBufferImmutableFlag(this), !bVar15 ||
        (bVar15 = CheckTransformFeedbackBufferSize(this), !bVar15)))) {
      bVar15 = false;
    }
    else {
      bVar15 = CheckTransformFeedbackResult(this);
    }
    Cleanup(this);
    do {
      iVar17 = (**(code **)(lVar18 + 0x800))();
    } while (iVar17 != 0);
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    if (bVar15 == false) {
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
    }
    else {
      description = "Pass";
      testResult = QP_TEST_RESULT_PASS;
    }
  }
  else {
    this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
    description = "Not Supported";
    testResult = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult FunctionalTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* API function pointers setup. */
	m_pClearNamedBufferData		   = (PFNGLCLEARNAMEDBUFFERDATA)gl.clearNamedBufferData;
	m_pClearNamedBufferSubData	 = (PFNGLCLEARNAMEDBUFFERSUBDATA)gl.clearNamedBufferSubData;
	m_pCopyNamedBufferSubData	  = (PFNGLCOPYNAMEDBUFFERSUBDATA)gl.copyNamedBufferSubData;
	m_pFlushMappedNamedBufferRange = (PFNGLFLUSHMAPPEDNAMEDBUFFERRANGE)gl.flushMappedNamedBufferRange;
	m_pGetNamedBufferParameteri64v = (PFNGLGETNAMEDBUFFERPARAMETERI64V)gl.getNamedBufferParameteri64v;
	m_pGetNamedBufferParameteriv   = (PFNGLGETNAMEDBUFFERPARAMETERIV)gl.getNamedBufferParameteriv;
	m_pGetNamedBufferPointerv	  = (PFNGLGETNAMEDBUFFERPOINTERV)gl.getNamedBufferPointerv;
	m_pGetNamedBufferSubData	   = (PFNGLGETNAMEDBUFFERSUBDATA)gl.getNamedBufferSubData;
	m_pMapNamedBuffer			   = (PFNGLMAPNAMEDBUFFER)gl.mapNamedBuffer;
	m_pMapNamedBufferRange		   = (PFNGLMAPNAMEDBUFFERRANGE)gl.mapNamedBufferRange;
	m_pNamedBufferData			   = (PFNGLNAMEDBUFFERDATA)gl.namedBufferData;
	m_pNamedBufferStorage		   = (PFNGLNAMEDBUFFERSTORAGE)gl.namedBufferStorage;
	m_pNamedBufferSubData		   = (PFNGLNAMEDBUFFERSUBDATA)gl.namedBufferSubData;
	m_pUnmapNamedBuffer			   = (PFNGLUNMAPNAMEDBUFFER)gl.unmapNamedBuffer;

	try
	{
		/* API function pointers check. */
		if ((DE_NULL == m_pClearNamedBufferData) || (DE_NULL == m_pClearNamedBufferSubData) ||
			(DE_NULL == m_pCopyNamedBufferSubData) || (DE_NULL == m_pFlushMappedNamedBufferRange) ||
			(DE_NULL == m_pGetNamedBufferParameteri64v) || (DE_NULL == m_pGetNamedBufferParameteriv) ||
			(DE_NULL == m_pGetNamedBufferPointerv) || (DE_NULL == m_pGetNamedBufferSubData) ||
			(DE_NULL == m_pMapNamedBuffer) || (DE_NULL == m_pMapNamedBufferRange) || (DE_NULL == m_pNamedBufferData) ||
			(DE_NULL == m_pNamedBufferStorage) || (DE_NULL == m_pNamedBufferSubData) ||
			(DE_NULL == m_pUnmapNamedBuffer))
		{
			throw 0;
		}

		/* Running test. */
		BuildProgram();
		PrepareVertexArrayObject();

		is_ok = is_ok && PrepareInputBuffer();
		is_ok = is_ok && PrepareOutputBuffer();

		if (is_ok)
		{
			Draw();
		}

		is_ok = is_ok && CheckArrayBufferImmutableFlag();
		is_ok = is_ok && CheckTransformFeedbackBufferSize();
		is_ok = is_ok && CheckTransformFeedbackResult();
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean Up. */
	Cleanup();

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}